

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_curves.cpp
# Opt level: O3

void __thiscall
agg::curve3_div::recursive_bezier
          (curve3_div *this,double x1,double y1,double x2,double y2,double x3,double y3,uint level)

{
  double *pdVar1;
  uint nb;
  uint uVar2;
  uint nb_00;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double x3_00;
  double y3_00;
  double dVar7;
  double dVar8;
  double dVar9;
  double x2_00;
  double y2_00;
  
  if (level < 0x21) {
    uVar2 = level + 1;
    do {
      x2_00 = (x1 + x2) * 0.5;
      y2_00 = (y1 + y2) * 0.5;
      dVar5 = (x2 + x3) * 0.5;
      dVar6 = (y2 + y3) * 0.5;
      x3_00 = (x2_00 + dVar5) * 0.5;
      y3_00 = (y2_00 + dVar6) * 0.5;
      dVar3 = x3 - x1;
      dVar4 = y3 - y1;
      dVar8 = (x2 - x3) * dVar4 - (y2 - y3) * dVar3;
      if (ABS(dVar8) <= 1e-30) {
        dVar8 = dVar3 * dVar3 + dVar4 * dVar4;
        dVar9 = x2 - x1;
        dVar7 = y2 - y1;
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          dVar8 = (dVar9 * dVar3 + dVar7 * dVar4) / dVar8;
          if ((0.0 < dVar8) && (dVar8 < 1.0)) {
            return;
          }
          dVar9 = y1;
          dVar7 = x1;
          if ((dVar8 <= 0.0) || (dVar9 = y3, dVar7 = x3, 1.0 <= dVar8)) {
            dVar3 = (dVar7 - x2) * (dVar7 - x2) + (dVar9 - y2) * (dVar9 - y2);
          }
          else {
            dVar3 = (dVar3 * dVar8 + x1) - x2;
            dVar4 = (dVar4 * dVar8 + y1) - y2;
            dVar3 = dVar3 * dVar3 + dVar4 * dVar4;
          }
        }
        else {
          dVar3 = dVar9 * dVar9 + dVar7 * dVar7;
        }
        if (dVar3 < *(double *)(this + 8)) {
          uVar2 = *(uint *)(this + 0x20);
          nb_00 = uVar2 >> 6;
          if (*(uint *)(this + 0x24) <= nb_00) {
            pod_bvector<agg::point_base<double>,_6U>::allocate_block
                      ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x20),nb_00);
            uVar2 = ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x20))->m_size;
          }
          goto LAB_00115abc;
        }
      }
      else if (dVar8 * dVar8 <= (dVar3 * dVar3 + dVar4 * dVar4) * *(double *)(this + 8)) {
        if (0.01 < *(double *)(this + 0x10) || *(double *)(this + 0x10) == 0.01) {
          dVar3 = atan2(y3 - y2,x3 - x2);
          dVar4 = atan2(y2 - y1,x2 - x1);
          dVar3 = ABS(dVar3 - dVar4);
          if (*(double *)(this + 0x10) <=
              (double)(~-(ulong)(dVar3 < 3.141592653589793) & (ulong)(6.283185307179586 - dVar3) |
                      (ulong)dVar3 & -(ulong)(dVar3 < 3.141592653589793))) goto LAB_00115a1c;
        }
        uVar2 = *(uint *)(this + 0x20);
        nb_00 = uVar2 >> 6;
        x2 = x3_00;
        y2 = y3_00;
        if (*(uint *)(this + 0x24) <= nb_00) {
          pod_bvector<agg::point_base<double>,_6U>::allocate_block
                    ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x20),nb_00);
          uVar2 = ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x20))->m_size;
        }
LAB_00115abc:
        pdVar1 = (double *)
                 (*(long *)(*(long *)(this + 0x30) + (ulong)nb_00 * 8) +
                 (ulong)((uVar2 & 0x3f) << 4));
        *pdVar1 = x2;
        pdVar1[1] = y2;
        *(uint *)(this + 0x20) = uVar2 + 1;
        return;
      }
LAB_00115a1c:
      recursive_bezier(this,x1,y1,x2_00,y2_00,x3_00,y3_00,uVar2);
      uVar2 = uVar2 + 1;
      x2 = dVar5;
      y2 = dVar6;
      x1 = x3_00;
      y1 = y3_00;
    } while (uVar2 != 0x22);
  }
  return;
}

Assistant:

void curve3_div::recursive_bezier(double x1, double y1, 
                                      double x2, double y2, 
                                      double x3, double y3,
                                      unsigned level)
    {
        if(level > curve_recursion_limit) 
        {
            return;
        }

        // Calculate all the mid-points of the line segments
        //----------------------
        double x12   = (x1 + x2) / 2;                
        double y12   = (y1 + y2) / 2;
        double x23   = (x2 + x3) / 2;
        double y23   = (y2 + y3) / 2;
        double x123  = (x12 + x23) / 2;
        double y123  = (y12 + y23) / 2;

        double dx = x3-x1;
        double dy = y3-y1;
        double d = fabs(((x2 - x3) * dy - (y2 - y3) * dx));
        double da;

        if(d > curve_collinearity_epsilon)
        { 
            // Regular case
            //-----------------
            if(d * d <= m_distance_tolerance_square * (dx*dx + dy*dy))
            {
                // If the curvature doesn't exceed the distance_tolerance value
                // we tend to finish subdivisions.
                //----------------------
                if(m_angle_tolerance < curve_angle_tolerance_epsilon)
                {
                    m_points.add(point_d(x123, y123));
                    return;
                }

                // Angle & Cusp Condition
                //----------------------
                da = fabs(atan2(y3 - y2, x3 - x2) - atan2(y2 - y1, x2 - x1));
                if(da >= pi) da = 2*pi - da;

                if(da < m_angle_tolerance)
                {
                    // Finally we can stop the recursion
                    //----------------------
                    m_points.add(point_d(x123, y123));
                    return;                 
                }
            }
        }
        else
        {
            // Collinear case
            //------------------
            da = dx*dx + dy*dy;
            if(da == 0)
            {
                d = calc_sq_distance(x1, y1, x2, y2);
            }
            else
            {
                d = ((x2 - x1)*dx + (y2 - y1)*dy) / da;
                if(d > 0 && d < 1)
                {
                    // Simple collinear case, 1---2---3
                    // We can leave just two endpoints
                    return;
                }
                     if(d <= 0) d = calc_sq_distance(x2, y2, x1, y1);
                else if(d >= 1) d = calc_sq_distance(x2, y2, x3, y3);
                else            d = calc_sq_distance(x2, y2, x1 + d*dx, y1 + d*dy);
            }
            if(d < m_distance_tolerance_square)
            {
                m_points.add(point_d(x2, y2));
                return;
            }
        }

        // Continue subdivision
        //----------------------
        recursive_bezier(x1, y1, x12, y12, x123, y123, level + 1); 
        recursive_bezier(x123, y123, x23, y23, x3, y3, level + 1); 
    }